

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_disable_deviations(lys_module *module)

{
  byte bVar1;
  lys_module **pplVar2;
  char *__needle;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  unres_schema *local_40;
  unres_schema *unres;
  
  if ((module->field_0x40 & 0x30) != 0) {
    local_40 = (unres_schema *)calloc(1,0x28);
    if (local_40 == (unres_schema *)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_disable_deviations");
      return;
    }
    for (uVar6 = (ulong)(uint)(module->ctx->models).used; uVar6 != 0; uVar6 = uVar6 - 1) {
      unres = (unres_schema *)(module->ctx->models).list[uVar6 - 1];
      if (((lys_module *)unres != module) && ((ulong)((lys_module *)unres)->deviation_size != 0)) {
        lVar7 = (ulong)((lys_module *)unres)->deviation_size * 0x38 + -0x38;
        do {
          pplVar2 = unres[3].module;
          __needle = module->name;
          pcVar4 = strstr(*(char **)((long)pplVar2 + lVar7),__needle);
          if ((pcVar4 != (char *)0x0) && (sVar5 = strlen(__needle), pcVar4[sVar5] == ':')) {
            lys_switch_deviation
                      ((lys_deviation *)((long)pplVar2 + lVar7),(lys_module *)unres,local_40);
          }
          lVar7 = lVar7 + -0x38;
        } while (lVar7 != -0x38);
      }
    }
    if ((*(ushort *)&module->field_0x40 & 0x30) != 0x10) {
      __assert_fail("module->deviated == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                    ,0x1232,"void lys_disable_deviations(struct lys_module *)");
    }
    *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 & 0xffcf | 0x20;
    if (module->inc_size != '\0') {
      lVar7 = 0;
      uVar6 = 0;
      do {
        lVar3 = *(long *)(module->inc->rev + lVar7 + -8);
        bVar1 = *(byte *)(lVar3 + 0x40);
        if ((bVar1 & 0x30) != 0) {
          *(byte *)(lVar3 + 0x40) = bVar1 & 0xcf | module->field_0x40 & 0x30;
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x30;
      } while (uVar6 < module->inc_size);
    }
    if (local_40->count != 0) {
      resolve_unres_schema(module,local_40);
    }
    unres_schema_free(module,&local_40,1);
  }
  return;
}

Assistant:

void
lys_disable_deviations(struct lys_module *module)
{
    uint32_t i, j;
    const struct lys_module *mod;
    const char *ptr;
    struct unres_schema *unres;

    if (module->deviated) {
        unres = calloc(1, sizeof *unres);
        LY_CHECK_ERR_RETURN(!unres, LOGMEM(module->ctx), );

        i = module->ctx->models.used;
        while (i--) {
            mod = module->ctx->models.list[i];

            if (mod == module) {
                continue;
            }

            j = mod->deviation_size;
            while (j--) {
                ptr = strstr(mod->deviation[j].target_name, module->name);
                if (ptr && ptr[strlen(module->name)] == ':') {
                    lys_switch_deviation(&mod->deviation[j], mod, unres);
                }
            }
        }

        assert(module->deviated == 1);
        module->deviated = 2;

        for (j = 0; j < module->inc_size; j++) {
            if (module->inc[j].submodule->deviated) {
                module->inc[j].submodule->deviated = module->deviated;
            }
        }

        if (unres->count) {
            resolve_unres_schema(module, unres);
        }
        unres_schema_free(module, &unres, 1);
    }
}